

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.hpp
# Opt level: O2

MessageBuilder * __thiscall tcu::MessageBuilder::operator<<(MessageBuilder *this,LogVecComps *value)

{
  ostringstream *stream;
  int iVar1;
  Vector<float,_2> local_24;
  
  stream = &this->m_str;
  iVar1 = value->numComps;
  if (iVar1 == 3) {
    Vector<float,_4>::toWidth<3>((Vector<float,_4> *)&local_24);
    tcu::operator<<((ostream *)stream,(Vector<float,_3> *)&local_24);
  }
  else if (iVar1 == 2) {
    Vector<float,_4>::toWidth<2>(value->v);
    tcu::operator<<((ostream *)stream,&local_24);
  }
  else if (iVar1 == 1) {
    std::ostream::operator<<(stream,value->v->m_data[0]);
  }
  else {
    tcu::operator<<((ostream *)stream,value->v);
  }
  return this;
}

Assistant:

inline MessageBuilder& MessageBuilder::operator<< (const T& value)
{
	// Overload stream operator to implement custom format
	m_str << value;
	return *this;
}